

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_AmrMesh.cpp
# Opt level: O2

ostream * amrex::operator<<(ostream *os,AmrMesh *amr_mesh)

{
  ostream *poVar1;
  long lVar2;
  int lev;
  long lVar3;
  
  poVar1 = std::operator<<(os,"  verbose = ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(amr_mesh->super_AmrInfo).verbose);
  std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<(os,"  max_level = ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(amr_mesh->super_AmrInfo).max_level);
  std::operator<<(poVar1,"\n");
  std::operator<<(os,"  ref_ratio =");
  lVar2 = 0;
  for (lVar3 = 0; lVar3 < (amr_mesh->super_AmrInfo).max_level; lVar3 = lVar3 + 1) {
    poVar1 = std::operator<<(os," ");
    operator<<(poVar1,(IntVect *)
                      ((long)((amr_mesh->super_AmrInfo).ref_ratio.
                              super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
                              super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
                              _M_impl.super__Vector_impl_data._M_start)->vect + lVar2));
    lVar2 = lVar2 + 0xc;
  }
  std::operator<<(os,"\n");
  std::operator<<(os,"  blocking_factor =");
  lVar2 = 0;
  for (lVar3 = 0; lVar3 <= (amr_mesh->super_AmrInfo).max_level; lVar3 = lVar3 + 1) {
    poVar1 = std::operator<<(os," ");
    operator<<(poVar1,(IntVect *)
                      ((long)((amr_mesh->super_AmrInfo).blocking_factor.
                              super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
                              super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
                              _M_impl.super__Vector_impl_data._M_start)->vect + lVar2));
    lVar2 = lVar2 + 0xc;
  }
  std::operator<<(os,"\n");
  std::operator<<(os,"  max_grid_size =");
  lVar2 = 0;
  for (lVar3 = 0; lVar3 <= (amr_mesh->super_AmrInfo).max_level; lVar3 = lVar3 + 1) {
    poVar1 = std::operator<<(os," ");
    operator<<(poVar1,(IntVect *)
                      ((long)((amr_mesh->super_AmrInfo).max_grid_size.
                              super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
                              super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
                              _M_impl.super__Vector_impl_data._M_start)->vect + lVar2));
    lVar2 = lVar2 + 0xc;
  }
  std::operator<<(os,"\n");
  std::operator<<(os,"  n_error_buf =");
  lVar2 = 0;
  for (lVar3 = 0; lVar3 < (amr_mesh->super_AmrInfo).max_level; lVar3 = lVar3 + 1) {
    poVar1 = std::operator<<(os," ");
    operator<<(poVar1,(IntVect *)
                      ((long)((amr_mesh->super_AmrInfo).n_error_buf.
                              super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
                              super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
                              _M_impl.super__Vector_impl_data._M_start)->vect + lVar2));
    lVar2 = lVar2 + 0xc;
  }
  std::operator<<(os,"\n");
  std::operator<<(os,"  grid_eff = ");
  poVar1 = std::ostream::_M_insert<double>((amr_mesh->super_AmrInfo).grid_eff);
  std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<(os,"  n_proper = ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(amr_mesh->super_AmrInfo).n_proper);
  std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<(os,"  use_fixed_upto_level = ");
  poVar1 = (ostream *)
           std::ostream::operator<<(poVar1,(amr_mesh->super_AmrInfo).use_fixed_upto_level);
  std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<(os,"  use_fixed_coarse_grids = ");
  poVar1 = std::ostream::_M_insert<bool>(SUB81(poVar1,0));
  std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<(os,"  refine_grid_layout_dims = ");
  poVar1 = operator<<(poVar1,&(amr_mesh->super_AmrInfo).refine_grid_layout_dims);
  std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<(os,"  check_input = ");
  poVar1 = std::ostream::_M_insert<bool>(SUB81(poVar1,0));
  std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<(os,"  use_new_chop = ");
  poVar1 = std::ostream::_M_insert<bool>(SUB81(poVar1,0));
  std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<(os,"  iterate_on_new_grids = ");
  poVar1 = std::ostream::_M_insert<bool>(SUB81(poVar1,0));
  std::operator<<(poVar1,"\n");
  return os;
}

Assistant:

std::ostream& operator<< (std::ostream& os, AmrMesh const& amr_mesh)
{
    os << "  verbose = " << amr_mesh.verbose << "\n";
    os << "  max_level = " << amr_mesh.max_level << "\n";
    os << "  ref_ratio =";
    for (int lev = 0; lev < amr_mesh.max_level; ++lev) os << " " << amr_mesh.ref_ratio[lev];
    os << "\n";
    os << "  blocking_factor =";
    for (int lev = 0; lev <= amr_mesh.max_level; ++lev) os << " " << amr_mesh.blocking_factor[lev];
    os << "\n";
    os << "  max_grid_size =";
    for (int lev = 0; lev <= amr_mesh.max_level; ++lev) os << " " << amr_mesh.max_grid_size[lev];
    os << "\n";
    os << "  n_error_buf =";
    for (int lev = 0; lev < amr_mesh.max_level; ++lev) os << " " << amr_mesh.n_error_buf[lev];
    os << "\n";
    os << "  grid_eff = " << amr_mesh.grid_eff << "\n";
    os << "  n_proper = " << amr_mesh.n_proper << "\n";
    os << "  use_fixed_upto_level = " << amr_mesh.use_fixed_upto_level << "\n";
    os << "  use_fixed_coarse_grids = " << amr_mesh.use_fixed_coarse_grids << "\n";
    os << "  refine_grid_layout_dims = " << amr_mesh.refine_grid_layout_dims << "\n";
    os << "  check_input = " << amr_mesh.check_input  << "\n";
    os << "  use_new_chop = " << amr_mesh.use_new_chop << "\n";
    os << "  iterate_on_new_grids = " << amr_mesh.iterate_on_new_grids << "\n";
    return os;
}